

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_IRCJoin.cpp
# Opt level: O0

bool __thiscall RenX_IRCJoinPlugin::initialize(RenX_IRCJoinPlugin *this)

{
  bool bVar1;
  int iVar2;
  basic_string_view<char,_std::char_traits<char>_> bVar3;
  basic_string_view<char,_std::char_traits<char>_> bVar4;
  size_t local_180;
  char *local_178;
  size_t local_170;
  char *local_168;
  basic_string_view<char,_std::char_traits<char>_> local_160;
  basic_string_view<char,_std::char_traits<char>_> local_150;
  basic_string_view<char,_std::char_traits<char>_> local_140;
  basic_string_view<char,_std::char_traits<char>_> local_130;
  basic_string_view<char,_std::char_traits<char>_> local_120;
  basic_string_view<char,_std::char_traits<char>_> local_110;
  basic_string_view<char,_std::char_traits<char>_> local_100;
  basic_string_view<char,_std::char_traits<char>_> local_f0;
  basic_string_view<char,_std::char_traits<char>_> local_e0;
  basic_string_view<char,_std::char_traits<char>_> local_d0;
  basic_string_view<char,_std::char_traits<char>_> local_c0;
  basic_string_view<char,_std::char_traits<char>_> local_b0;
  basic_string_view<char,_std::char_traits<char>_> local_a0;
  basic_string_view<char,_std::char_traits<char>_> local_90;
  basic_string_view<char,_std::char_traits<char>_> local_80;
  basic_string_view<char,_std::char_traits<char>_> local_70;
  basic_string_view<char,_std::char_traits<char>_> local_60;
  basic_string_view<char,_std::char_traits<char>_> local_50;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  basic_string_view<char,_std::char_traits<char>_> local_30;
  basic_string_view<char,_std::char_traits<char>_> local_20;
  RenX_IRCJoinPlugin *local_10;
  RenX_IRCJoinPlugin *this_local;
  
  local_10 = this;
  local_20 = sv("PublicOnly",10);
  bVar1 = Jupiter::Config::get<bool>((Config *)&this->field_0x38,local_20,true);
  this->publicOnly = bVar1;
  local_30 = sv("Join.MsgAlways",0xe);
  bVar1 = Jupiter::Config::get<bool>((Config *)&this->field_0x38,local_30,false);
  this->joinMsgAlways = bVar1;
  local_40 = sv("Part.MsgAlways",0xe);
  bVar1 = Jupiter::Config::get<bool>((Config *)&this->field_0x38,local_40,false);
  this->partMsgAlways = bVar1;
  local_50 = sv("Part.MinAccess",0xe);
  iVar2 = Jupiter::Config::get<int>((Config *)&this->field_0x38,local_50,0);
  this->minAccessPartMessage = iVar2;
  local_60 = sv("Part.MaxAccess",0xe);
  iVar2 = Jupiter::Config::get<int>((Config *)&this->field_0x38,local_60,-1);
  this->maxAccessPartMessage = iVar2;
  local_80 = sv("NameTag",7);
  local_90 = sv("{NAME}",6);
  local_70 = (basic_string_view<char,_std::char_traits<char>_>)
             Jupiter::Config::get
                       (&this->field_0x38,local_80._M_len,local_80._M_str,local_90._M_len,
                        local_90._M_str);
  std::__cxx11::string::operator=((string *)&this->nameTag,&local_70);
  local_b0 = sv("ChannelTag",10);
  local_c0 = sv("{CHAN}",6);
  local_a0 = (basic_string_view<char,_std::char_traits<char>_>)
             Jupiter::Config::get
                       (&this->field_0x38,local_b0._M_len,local_b0._M_str,local_c0._M_len,
                        local_c0._M_str);
  std::__cxx11::string::operator=((string *)&this->chanTag,&local_a0);
  local_e0 = sv("PartReasonTag",0xd);
  local_f0 = sv("{REASON}",8);
  local_d0 = (basic_string_view<char,_std::char_traits<char>_>)
             Jupiter::Config::get
                       (&this->field_0x38,local_e0._M_len,local_e0._M_str,local_f0._M_len,
                        local_f0._M_str);
  std::__cxx11::string::operator=((string *)&this->partReasonTag,&local_d0);
  local_110 = sv("Join.Format",0xb);
  local_120 = sv("{NAME} has joined {CHAN}!",0x19);
  local_100 = (basic_string_view<char,_std::char_traits<char>_>)
              Jupiter::Config::get
                        (&this->field_0x38,local_110._M_len,local_110._M_str,local_120._M_len,
                         local_120._M_str);
  std::__cxx11::string::operator=((string *)&this->joinFmt,&local_100);
  local_140 = sv("Part.Format",0xb);
  local_150 = sv("{NAME} has left {CHAN} ({REASON})!",0x22);
  local_130 = (basic_string_view<char,_std::char_traits<char>_>)
              Jupiter::Config::get
                        (&this->field_0x38,local_140._M_len,local_140._M_str,local_150._M_len,
                         local_150._M_str);
  std::__cxx11::string::operator=((string *)&this->partFmt,&local_130);
  bVar3 = sv("Part.FormatNoReason",0x13);
  bVar4 = sv("{NAME} has left {CHAN}!",0x17);
  local_170 = bVar3._M_len;
  local_168 = bVar3._M_str;
  local_180 = bVar4._M_len;
  local_178 = bVar4._M_str;
  local_160 = (basic_string_view<char,_std::char_traits<char>_>)
              Jupiter::Config::get(&this->field_0x38,local_170,local_168,local_180,local_178);
  std::__cxx11::string::operator=((string *)&this->partFmtNoReason,&local_160);
  return true;
}

Assistant:

bool RenX_IRCJoinPlugin::initialize() {
	RenX_IRCJoinPlugin::publicOnly = this->config.get<bool>("PublicOnly"sv, true);
	RenX_IRCJoinPlugin::joinMsgAlways = this->config.get<bool>("Join.MsgAlways"sv, false);
	RenX_IRCJoinPlugin::partMsgAlways = this->config.get<bool>("Part.MsgAlways"sv, false);
	RenX_IRCJoinPlugin::minAccessPartMessage = this->config.get<int>("Part.MinAccess"sv, 0);
	RenX_IRCJoinPlugin::maxAccessPartMessage = this->config.get<int>("Part.MaxAccess"sv, -1);
	RenX_IRCJoinPlugin::nameTag = this->config.get("NameTag"sv, "{NAME}"sv);
	RenX_IRCJoinPlugin::chanTag = this->config.get("ChannelTag"sv, "{CHAN}"sv);
	RenX_IRCJoinPlugin::partReasonTag = this->config.get("PartReasonTag"sv, "{REASON}"sv);
	RenX_IRCJoinPlugin::joinFmt = this->config.get("Join.Format"sv, "{NAME} has joined {CHAN}!"sv);
	RenX_IRCJoinPlugin::partFmt = this->config.get("Part.Format"sv, "{NAME} has left {CHAN} ({REASON})!"sv);
	RenX_IRCJoinPlugin::partFmtNoReason = this->config.get("Part.FormatNoReason"sv, "{NAME} has left {CHAN}!"sv);

	return true;
}